

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_MAMA_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000248;
  int *in_stack_00000250;
  int *in_stack_00000258;
  double in_stack_00000260;
  double in_stack_00000268;
  double *in_stack_00000270;
  int in_stack_0000027c;
  int in_stack_00000280;
  double *in_stack_00000290;
  
  TVar1 = TA_MAMA(in_stack_00000280,in_stack_0000027c,in_stack_00000270,in_stack_00000268,
                  in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248,
                  in_stack_00000290);
  return TVar1;
}

Assistant:

TA_RetCode TA_MAMA_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_MAMA(
/* Generated */              startIdx,
/* Generated */              endIdx,
/* Generated */              params->in[0].data.inReal, /* inReal */
/* Generated */              params->optIn[0].data.optInReal, /* optInFastLimit*/
/* Generated */              params->optIn[1].data.optInReal, /* optInSlowLimit*/
/* Generated */              outBegIdx, 
/* Generated */              outNBElement, 
/* Generated */              params->out[0].data.outReal, /*  outMAMA */
/* Generated */              params->out[1].data.outReal /*  outFAMA */ );
/* Generated */ }